

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O2

void __thiscall
test::string_assertion_test::iu_StrCaseTest_x_iutest_x_NeString_Test<wchar_t>::Body
          (iu_StrCaseTest_x_iutest_x_NeString_Test<wchar_t> *this)

{
  AssertionResult iutest_ar;
  String host;
  String test;
  AssertionResult local_228;
  iuCodeMessage local_200;
  wchar_t *local_1d0 [4];
  wchar_t *local_1b0 [4];
  Fixed local_190;
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)local_1b0,(wchar_t *)text<wchar_t>::test,(allocator<wchar_t> *)&local_190);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)local_1d0,(wchar_t *)text<wchar_t>::host,(allocator<wchar_t> *)&local_190);
  iutest::internal::CmpHelperSTRCASENE
            (&local_228,"host","TestFixture::Text::test",local_1d0[0],(wchar_t *)text<wchar_t>::test
            );
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xe8,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_228);
  iutest::internal::CmpHelperSTRCASENE(&local_228,"host","test",local_1d0[0],local_1b0[0]);
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xe9,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_228);
  iutest::internal::CmpHelperSTRCASENE
            (&local_228,"TestFixture::Text::test","host",(wchar_t *)text<wchar_t>::test,local_1d0[0]
            );
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xea,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_228);
  iutest::internal::CmpHelperSTRCASENE
            (&local_228,"host","TestFixture::Text::test",local_1d0[0],(wchar_t *)text<wchar_t>::test
            );
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xec,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_228);
  iutest::internal::CmpHelperSTRCASENE(&local_228,"host","test",local_1d0[0],local_1b0[0]);
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xed,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_228);
  iutest::internal::CmpHelperSTRCASENE
            (&local_228,"TestFixture::Text::test","host",(wchar_t *)text<wchar_t>::test,local_1d0[0]
            );
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xee,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_228);
  iutest::internal::CmpHelperSTRCASENE
            (&local_228,"host","TestFixture::Text::test",local_1d0[0],(wchar_t *)text<wchar_t>::test
            );
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xf0,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
  }
  else {
    std::__cxx11::string::~string((string *)&local_228);
    iutest::internal::CmpHelperSTRCASENE(&local_228,"host","test",local_1d0[0],local_1b0[0]);
    if (local_228.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0xf1,local_228.m_message._M_dataplus._M_p);
      local_200._44_4_ = 2;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    }
    else {
      std::__cxx11::string::~string((string *)&local_228);
      iutest::internal::CmpHelperSTRCASENE
                (&local_228,"TestFixture::Text::test","host",(wchar_t *)text<wchar_t>::test,
                 local_1d0[0]);
      if (local_228.m_result != false) goto LAB_002deafc;
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0xf2,local_228.m_message._M_dataplus._M_p);
      local_200._44_4_ = 2;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    }
  }
  std::__cxx11::string::~string((string *)&local_200);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_002deafc:
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::wstring::~wstring((wstring *)local_1d0);
  std::__cxx11::wstring::~wstring((wstring *)local_1b0);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, NeString)
{
    typename TestFixture::String test = TestFixture::Text::test;
    typename TestFixture::String host = TestFixture::Text::host;
    IUTEST_INFORM_STRCASENE(host, TestFixture::Text::test);
    IUTEST_INFORM_STRCASENE(host, test);
    IUTEST_INFORM_STRCASENE(TestFixture::Text::test, host);

    IUTEST_EXPECT_STRCASENE(host, TestFixture::Text::test);
    IUTEST_EXPECT_STRCASENE(host, test);
    IUTEST_EXPECT_STRCASENE(TestFixture::Text::test, host);

    IUTEST_ASSERT_STRCASENE(host, TestFixture::Text::test);
    IUTEST_ASSERT_STRCASENE(host, test);
    IUTEST_ASSERT_STRCASENE(TestFixture::Text::test, host);
}